

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  pointer pcVar1;
  cmState *this_00;
  ostream *poVar2;
  pointer ppVar3;
  char *pcVar4;
  pointer ppVar5;
  cmListFileContext lfc;
  cmOutputConverter converter;
  allocator local_dd;
  TLLSignature local_dc;
  undefined1 local_d8 [32];
  string local_b8;
  long local_98;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  cmOutputConverter local_50;
  
  pcVar4 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar4 = "keyword";
  }
  local_dc = sig;
  std::__ostream_insert<char,std::char_traits<char>>(s,"The uses of the ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (s,pcVar4,(ulong)(sig == KeywordTLLSignature) * 2 + 5);
  std::__ostream_insert<char,std::char_traits<char>>(s," signature are here:\n",0x15);
  cmMakefile::GetStateSnapshot(this->Makefile);
  cmOutputConverter::cmOutputConverter(&local_50,(cmStateSnapshot *)local_d8);
  ppVar5 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar3) {
    do {
      if (ppVar5->first == local_dc) {
        local_d8._0_8_ = local_d8 + 0x10;
        pcVar1 = (ppVar5->second).Name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,pcVar1,pcVar1 + (ppVar5->second).Name._M_string_length);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        pcVar1 = (ppVar5->second).FilePath._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar1,pcVar1 + (ppVar5->second).FilePath._M_string_length);
        local_98 = (ppVar5->second).Line;
        this_00 = cmMakefile::GetState(this->Makefile);
        pcVar4 = cmState::GetSourceDirectory(this_00);
        std::__cxx11::string::string((string *)&local_90,pcVar4,&local_dd);
        cmOutputConverter::ConvertToRelativePath((string *)&local_70,&local_50,&local_90,&local_b8);
        std::__cxx11::string::operator=((string *)&local_b8,(string *)local_70._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_allocated_capacity != &local_60) {
          operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(s," * ",3);
        poVar2 = operator<<(s,(cmListFileContext *)local_d8);
        std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((cmState *)local_d8._0_8_ != (cmState *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
        ppVar3 = (this->TLLCommands).
                 super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar3);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  typedef std::vector<std::pair<TLLSignature, cmListFileContext> > Container;
  cmOutputConverter converter(this->GetMakefile()->GetStateSnapshot());
  for (Container::const_iterator it = this->TLLCommands.begin();
       it != this->TLLCommands.end(); ++it) {
    if (it->first == sig) {
      cmListFileContext lfc = it->second;
      lfc.FilePath = converter.ConvertToRelativePath(
        this->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << std::endl;
    }
  }
}